

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O2

Aig_Man_t * Aig_ManDupOneOutput(Aig_Man_t *p,int iPoNum,int fAddRegs)

{
  Aig_Man_t *p_00;
  char *pcVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *p1;
  int iVar5;
  
  if (p->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDup.c"
                  ,0x485,"Aig_Man_t *Aig_ManDupOneOutput(Aig_Man_t *, int, int)");
  }
  if (iPoNum < p->nObjs[3] - p->nRegs) {
    p_00 = Aig_ManStart(p->vObjs->nSize);
    pcVar1 = Abc_UtilStrsav(p->pName);
    p_00->pName = pcVar1;
    pcVar1 = Abc_UtilStrsav(p->pSpec);
    p_00->pSpec = pcVar1;
    Aig_ManCleanData(p);
    p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
    for (iVar5 = 0; iVar5 < p->vCis->nSize; iVar5 = iVar5 + 1) {
      pvVar2 = Vec_PtrEntry(p->vCis,iVar5);
      pAVar3 = Aig_ObjCreateCi(p_00);
      *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar3;
    }
    if (fAddRegs == 0) {
      p_00->nRegs = 0;
      iVar5 = p->nRegs + p->nTruePis;
    }
    else {
      p_00->nRegs = p->nRegs;
      iVar5 = p->nTruePis;
    }
    p_00->nTruePis = iVar5;
    p_00->nTruePos = 1;
    for (iVar5 = 0; iVar5 < p->vObjs->nSize; iVar5 = iVar5 + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar5);
      if ((pAVar3 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar3->field_0x18 & 7) - 7)) {
        pAVar4 = Aig_ObjChild0Copy(pAVar3);
        p1 = Aig_ObjChild1Copy(pAVar3);
        pAVar4 = Aig_And(p_00,pAVar4,p1);
        (pAVar3->field_5).pData = pAVar4;
      }
    }
    pAVar3 = Aig_ManCo(p,iPoNum);
    pAVar3 = Aig_ObjChild0Copy(pAVar3);
    Aig_ObjCreateCo(p_00,pAVar3);
    if (fAddRegs != 0) {
      for (iVar5 = p->nObjs[3] - p->nRegs; iVar5 < p->vCos->nSize; iVar5 = iVar5 + 1) {
        pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar5);
        pAVar3 = Aig_ObjChild0Copy(pAVar3);
        Aig_ObjCreateCo(p_00,pAVar3);
      }
    }
    Aig_ManCleanup(p_00);
    return p_00;
  }
  __assert_fail("iPoNum < Aig_ManCoNum(p)-Aig_ManRegNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDup.c"
                ,0x486,"Aig_Man_t *Aig_ManDupOneOutput(Aig_Man_t *, int, int)");
}

Assistant:

Aig_Man_t * Aig_ManDupOneOutput( Aig_Man_t * p, int iPoNum, int fAddRegs )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj = NULL;
    int i;
    assert( Aig_ManRegNum(p) > 0 );
    assert( iPoNum < Aig_ManCoNum(p)-Aig_ManRegNum(p) );
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // set registers
    pNew->nRegs    = fAddRegs? p->nRegs : 0;
    pNew->nTruePis = fAddRegs? p->nTruePis : p->nTruePis + p->nRegs;
    pNew->nTruePos = 1;
    // duplicate internal nodes
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create the PO
    pObj = Aig_ManCo( p, iPoNum );
    Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    // create register inputs with MUXes
    if ( fAddRegs )
    {
        Aig_ManForEachLiSeq( p, pObj, i )
            Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    Aig_ManCleanup( pNew );
    return pNew;
}